

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

ExprPtr __thiscall
mathiu::impl::
set<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>
          (impl *this,shared_ptr<const_mathiu::impl::Expr> *lst,
          shared_ptr<const_mathiu::impl::Expr> *lst_1,shared_ptr<const_mathiu::impl::Expr> *lst_2)

{
  initializer_list<std::shared_ptr<const_mathiu::impl::Expr>_> __l;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExprPtr EVar1;
  shared_ptr<const_mathiu::impl::Expr> *local_d8;
  allocator<std::shared_ptr<const_mathiu::impl::Expr>_> local_9a;
  ExprPtrLess local_99;
  undefined1 local_98 [32];
  shared_ptr<const_mathiu::impl::Expr> local_78;
  shared_ptr<const_mathiu::impl::Expr> local_68;
  set<std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_58;
  shared_ptr<const_mathiu::impl::Expr> *local_28;
  shared_ptr<const_mathiu::impl::Expr> *lst_local_2;
  shared_ptr<const_mathiu::impl::Expr> *lst_local_1;
  shared_ptr<const_mathiu::impl::Expr> *lst_local;
  
  local_28 = lst_2;
  lst_local_2 = lst_1;
  lst_local_1 = lst;
  lst_local = (shared_ptr<const_mathiu::impl::Expr> *)this;
  std::shared_ptr<const_mathiu::impl::Expr>::shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_98,lst);
  std::shared_ptr<const_mathiu::impl::Expr>::shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)(local_98 + 0x10),lst_local_2);
  std::shared_ptr<const_mathiu::impl::Expr>::shared_ptr(&local_78,local_28);
  local_68.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  local_68.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_98;
  std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>::allocator(&local_9a);
  __l._M_len = (size_type)
               local_68.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  __l._M_array = (iterator)
                 local_68.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  std::
  set<std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::set(&local_58,__l,&local_99,&local_9a);
  makeSharedExprPtr<mathiu::impl::Set>((Set *)this);
  Set::~Set((Set *)&local_58);
  std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>::~allocator(&local_9a);
  local_d8 = &local_68;
  do {
    local_d8 = local_d8 + -1;
    std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(local_d8);
  } while (local_d8 != (shared_ptr<const_mathiu::impl::Expr> *)local_98);
  EVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline ExprPtr set(Ts &&... lst)
        {
            return makeSharedExprPtr(Set{{lst...}});
        }